

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateMetadataFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  int iVar1;
  undefined4 extraout_var;
  bool in_CL;
  FileDescriptor *file_00;
  undefined7 in_register_00000031;
  string fullname;
  string filename;
  Printer printer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  Printer local_c8;
  ZeroCopyOutputStream *output;
  
  file_00 = (FileDescriptor *)(CONCAT71(in_register_00000031,is_descriptor) & 0xffffffff);
  GeneratedMetadataFileName_abi_cxx11_(&local_e8,(php *)file,file_00,in_CL);
  iVar1 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_e8);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
  io::Printer::Printer(&local_c8,output,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_c8,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)file);
  FilenameToClassname(&local_108,&local_e8);
  iVar1 = std::__cxx11::string::find_last_of((char *)&local_108,0x39571d,0xffffffffffffffff);
  if (iVar1 == -1) {
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_c8,"class ^name^\n{\n",(char (*) [5])0x3958cc,&local_108);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_108);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_c8,"namespace ^name^;\n\n",(char (*) [5])0x3958cc,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_128,(ulong)&local_108);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_c8,"class ^name^\n{\n",(char (*) [5])0x3958cc,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
  }
  io::Printer::Indent(&local_c8);
  io::Printer::Indent(&local_c8);
  GenerateAddFileToPool(file,SUB81(file_00,0),&local_c8);
  io::Printer::Outdent(&local_c8);
  io::Printer::Outdent(&local_c8);
  io::Printer::Print<>(&local_c8,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  io::Printer::~Printer(&local_c8);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateMetadataFile(const FileDescriptor* file,
                          bool is_descriptor,
                          GeneratorContext* generator_context) {
  std::string filename = GeneratedMetadataFileName(file, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  GenerateAddFileToPool(file, is_descriptor, &printer);

  Outdent(&printer);
  printer.Print("}\n\n");
}